

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

int __thiscall MovDemuxer::mov_read_trex(MovDemuxer *this,MOVAtom atom)

{
  pointer pMVar1;
  uint uVar2;
  
  std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>::emplace_back<>
            (&this->trex_data);
  pMVar1 = (this->trex_data).
           super__Vector_base<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be24(&this->super_IOContextDemuxer);
  uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar1[-1].track_id = uVar2;
  uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar1[-1].stsd_id = uVar2;
  uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar1[-1].duration = uVar2;
  uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar1[-1].size = uVar2;
  uVar2 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pMVar1[-1].flags = uVar2;
  return 0;
}

Assistant:

int MovDemuxer::mov_read_trex(MOVAtom atom)
{
    trex_data.emplace_back();
    MOVTrackExt& trex = trex_data[trex_data.size() - 1];
    get_byte();  // version
    get_be24();  // flags
    trex.track_id = static_cast<int>(get_be32());
    trex.stsd_id = get_be32();
    trex.duration = get_be32();
    trex.size = get_be32();
    trex.flags = get_be32();
    return 0;
}